

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pr.cpp
# Opt level: O3

int pr_set_level(int level)

{
  int iVar1;
  int iVar2;
  
  iVar1 = pr_level;
  iVar2 = 0;
  if (0 < level) {
    iVar2 = level;
  }
  pr_level = 3;
  if (iVar2 < 3) {
    pr_level = iVar2;
  }
  return iVar1;
}

Assistant:

int pr_set_level(int level)
{
    if(level >  PR_LEVEL_DEBUG)
    {
        level = PR_LEVEL_DEBUG;
    }
    else if(level < PR_LEVEL_ERROR)
    {
        level = PR_LEVEL_ERROR;
    }

    int old_level = pr_level;
    pr_level = level;

    return old_level;
}